

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Real Omega_h::repro_sum(CommPtr *comm,Reals *a)

{
  int iVar1;
  double dVar2;
  Int128 x;
  Write<double> local_50;
  Write<double> local_40;
  Int128 local_30;
  
  begin_code("repro_sum(comm)",(char *)0x0);
  Write<double>::Write(&local_40,&a->write_);
  iVar1 = max_exponent((Reals *)&local_40);
  Write<double>::~Write(&local_40);
  iVar1 = Comm::allreduce<int>
                    ((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                     iVar1,OMEGA_H_MAX);
  dVar2 = ldexp(1.0,iVar1 + -0x34);
  Write<double>::Write(&local_50,&a->write_);
  x = int128_sum((Reals *)&local_50,dVar2);
  Write<double>::~Write(&local_50);
  local_30 = Comm::add_int128((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr,x);
  dVar2 = Int128::to_double(&local_30,dVar2);
  end_code();
  return dVar2;
}

Assistant:

Real repro_sum(CommPtr comm, Reals a) {
  begin_code("repro_sum(comm)");
  auto const init = ArithTraits<int>::min();
  auto expo0 = max_exponent(a);
  int expo = comm->allreduce(expo0, OMEGA_H_MAX);
  if (expo == init) return 0.0;
  double unit = exp2(double(expo - MANTISSA_BITS));
  Int128 fixpt_sum = int128_sum(a, unit);
  fixpt_sum = comm->add_int128(fixpt_sum);
  double ret = fixpt_sum.to_double(unit);
  end_code();
  return ret;
}